

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

MIPSCPU * cpu_mips_init_mips(uc_struct_conflict4 *uc)

{
  CPUClass *k;
  CPUMIPSState *env;
  CPUClass *cc;
  CPUState *cs;
  MIPSCPU *cpu;
  uc_struct_conflict4 *uc_local;
  
  uc_local = (uc_struct_conflict4 *)calloc(1,0xb9e0);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict4 *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 10;
    }
    else if (0xf < uc->cpu_model) {
      free(uc_local);
      return (MIPSCPU *)0x0;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x6c7);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    cpu_class_init((uc_struct *)uc,k);
    mips_cpu_class_init(k);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
    mips_cpu_initfn(uc,(CPUState *)uc_local);
    ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x6b9] =
         (TranslationBlock *)(mips_defs_mips + uc->cpu_model);
    if (((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x6b9] == (TranslationBlock *)0x0) {
      free(uc_local);
      uc_local = (uc_struct_conflict4 *)0x0;
    }
    else {
      mips_cpu_realizefn((CPUState *)uc_local);
      cpu_address_space_init_mips((CPUState *)uc_local,0,((CPUState *)uc_local)->memory);
      qemu_init_vcpu_mips((CPUState *)uc_local);
    }
  }
  return (MIPSCPU *)uc_local;
}

Assistant:

MIPSCPU *cpu_mips_init(struct uc_struct *uc)
{
    MIPSCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    CPUMIPSState *env;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#ifdef TARGET_MIPS64
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_MIPS64_R4000; // R4000
    } else if (uc->cpu_model + UC_CPU_MIPS32_I7200 + 1 >= mips_defs_number ) {
        free(cpu);
        return NULL;
    }
#else
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_MIPS32_74KF; // 74kf
    } else if (uc->cpu_model >= mips_defs_number) {
        free(cpu);
        return NULL;
    }
#endif

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    cpu_class_init(uc, cc);

    mips_cpu_class_init(cc);

    cpu_common_initfn(uc, cs);

    mips_cpu_initfn(uc, cs);

    env = &cpu->env;
    env->cpu_model = &(mips_defs[uc->cpu_model]);

    if (env->cpu_model == NULL) {
        free(cpu);
        return NULL;
    }

    mips_cpu_realizefn(cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}